

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O1

void __thiscall
Memory::CustomHeap::
CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
TrackDecommittedPages
          (CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
           *this,void *address,uint pageCount,void *segment)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this_00;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *this_01;
  
  bVar2 = CCLock::IsLocked((CCLock *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0x106,"(this->cs.IsLocked())","this->cs.IsLocked()");
    if (!bVar2) goto LAB_006aaa15;
    *puVar3 = 0;
  }
  if (segment == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0x107,"(segment)","segment");
    if (!bVar2) {
LAB_006aaa15:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = IsPreReservedSegment(this,segment);
  if (bVar2) {
    this_00 = GetPreReservedPageAllocator(this,segment);
    HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::TrackDecommittedPages
              (this_00,address,pageCount,segment);
    return;
  }
  this_01 = GetPageAllocator(this,segment);
  HeapPageAllocator<Memory::VirtualAllocWrapper>::TrackDecommittedPages
            (this_01,address,pageCount,segment);
  return;
}

Assistant:

void TrackDecommittedPages(void * address, uint pageCount, __in void* segment)
    {
        Assert(this->cs.IsLocked());
        Assert(segment);
        if (IsPreReservedSegment(segment))
        {
            this->GetPreReservedPageAllocator(segment)->TrackDecommittedPages(address, pageCount, segment);
        }
        else
        {
            this->GetPageAllocator(segment)->TrackDecommittedPages(address, pageCount, segment);
        }
    }